

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O2

Locale * icu_63::LocaleUtility::initLocaleFromName(UnicodeString *id,Locale *result)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint start;
  char buffer [128];
  Locale local_108;
  
  uVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      iVar2 = (id->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)(short)uVar1 >> 5;
    }
    if (iVar2 < 0x80) {
      start = 0;
      while( true ) {
        uVar3 = UnicodeString::indexOf(id,L'@',start);
        if ((int)uVar3 < 0) break;
        UnicodeString::extract(id,start,uVar3 - start,buffer + start,0x80 - start,kInvariant);
        buffer[uVar3] = '@';
        start = uVar3 + 1;
      }
      UnicodeString::extract(id,start,0x7fffffff,buffer + start,0x80 - start,kInvariant);
      Locale::createFromName(&local_108,buffer);
      Locale::operator=(result,&local_108);
      Locale::~Locale(&local_108);
      return result;
    }
  }
  Locale::setToBogus(result);
  return result;
}

Assistant:

Locale&
LocaleUtility::initLocaleFromName(const UnicodeString& id, Locale& result)
{
    enum { BUFLEN = 128 }; // larger than ever needed

    if (id.isBogus() || id.length() >= BUFLEN) {
        result.setToBogus();
    } else {
        /*
         * We need to convert from a UnicodeString to char * in order to
         * create a Locale.
         *
         * Problem: Locale ID strings may contain '@' which is a variant
         * character and cannot be handled by invariant-character conversion.
         *
         * Hack: Since ICU code can handle locale IDs with multiple encodings
         * of '@' (at least for EBCDIC; it's not known to be a problem for
         * ASCII-based systems),
         * we use regular invariant-character conversion for everything else
         * and manually convert U+0040 into a compiler-char-constant '@'.
         * While this compilation-time constant may not match the runtime
         * encoding of '@', it should be one of the encodings which ICU
         * recognizes.
         *
         * There should be only at most one '@' in a locale ID.
         */
        char buffer[BUFLEN];
        int32_t prev, i;
        prev = 0;
        for(;;) {
            i = id.indexOf((UChar)0x40, prev);
            if(i < 0) {
                // no @ between prev and the rest of the string
                id.extract(prev, INT32_MAX, buffer + prev, BUFLEN - prev, US_INV);
                break; // done
            } else {
                // normal invariant-character conversion for text between @s
                id.extract(prev, i - prev, buffer + prev, BUFLEN - prev, US_INV);
                // manually "convert" U+0040 at id[i] into '@' at buffer[i]
                buffer[i] = '@';
                prev = i + 1;
            }
        }
        result = Locale::createFromName(buffer);
    }
    return result;
}